

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O3

Interfaces __thiscall QDBusXmlToCpp::readInput(QDBusXmlToCpp *this)

{
  FILE *__stream;
  char cVar1;
  Data *pDVar2;
  long in_RSI;
  Data *pDVar3;
  QString *this_00;
  long in_FS_OFFSET;
  QStringView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QLatin1String QVar7;
  QString local_a0;
  QString local_88;
  Data *local_68;
  char16_t *pcStack_60;
  QArrayData *local_58;
  Data *pDStack_50;
  char16_t *local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  this_00 = (QString *)(in_RSI + 0x48);
  local_68 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_60 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&stack0xffffffffffffff98,this_00);
  if (*(long *)(in_RSI + 0x58) == 0) {
LAB_0010424e:
    this_00 = (QString *)&stack0xffffffffffffffa8;
    QVar5.m_data = (storage_type_conflict *)0x10;
    QVar5.m_size = (qsizetype)this_00;
    QString::fromLatin1(QVar5);
    local_88.d.d = (Data *)local_58;
    local_88.d.ptr = (char16_t *)pDStack_50;
    local_88.d.size = (qsizetype)local_48;
    QString::operator=((QString *)(in_RSI + 0xd0),&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    cVar1 = QFile::open(&stack0xffffffffffffff98,_stdin,1,0);
    if (cVar1 == '\0') {
      readInput((QDBusXmlToCpp *)&stack0xffffffffffffff98);
      goto LAB_001042d8;
    }
  }
  else {
    if (*(long *)(in_RSI + 0x58) == 1) {
      QVar4.m_data = *(storage_type **)(in_RSI + 0x50);
      QVar4.m_size = 1;
      QVar7.m_data = "-";
      QVar7.m_size = 1;
      cVar1 = QtPrivate::equalStrings(QVar4,QVar7);
      if (cVar1 != '\0') goto LAB_0010424e;
    }
LAB_001042d8:
    QString::operator=((QString *)(in_RSI + 0xd0),this_00);
    cVar1 = QFile::open(&stack0xffffffffffffff98,1);
    __stream = _stderr;
    if (cVar1 == '\0') {
      QString::toLocal8Bit((QByteArray *)&stack0xffffffffffffffa8,this_00);
      pDVar3 = pDStack_50;
      if (pDStack_50 == (Data *)0x0) {
        pDVar3 = (Data *)&QByteArray::_empty;
      }
      QIODevice::errorString();
      QString::toLocal8Bit((QByteArray *)&local_88,&local_a0);
      pDVar2 = (Data *)local_88.d.ptr;
      if ((Data *)local_88.d.ptr == (Data *)0x0) {
        pDVar2 = (Data *)&QByteArray::_empty;
      }
      fprintf(__stream,"qdbusxml2cpp: could not open input file \'%s\': %s\n",pDVar3,pDVar2);
      QByteArray::~QByteArray((QByteArray *)&local_88);
      QString::~QString(&local_a0);
      QByteArray::~QByteArray((QByteArray *)&stack0xffffffffffffffa8);
      goto LAB_0010445b;
    }
  }
  local_48 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pDStack_50 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  (this->globalClassName).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QVar6.m_data = (storage_type_conflict *)local_48;
  QVar6.m_size = (qsizetype)&local_88;
  QString::fromUtf8(QVar6);
  QDBusIntrospection::parseInterfaces(&this->globalClassName,(DiagnosticsReporter *)&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)(in_RSI + 0xe8) != '\x01') {
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    QFile::~QFile((QFile *)&stack0xffffffffffffff98);
    if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
      return (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_>
              )(QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_>
                )this;
    }
    __stack_chk_fail();
  }
LAB_0010445b:
  exit(1);
}

Assistant:

QDBusIntrospection::Interfaces QDBusXmlToCpp::readInput()
{
    QFile input(inputFile);
    if (inputFile.isEmpty() || inputFile == "-"_L1) {
        reporter.setFileName("<standard input>"_L1);
        if (!input.open(stdin, QIODevice::ReadOnly)) {
            fprintf(stderr, PROGRAMNAME ": could not open standard input: %s\n",
                    qPrintable(input.errorString()));
            exit(1);
        }
    } else {
        reporter.setFileName(inputFile);
        if (!input.open(QIODevice::ReadOnly)) {
            fprintf(stderr, PROGRAMNAME ": could not open input file '%s': %s\n",
                    qPrintable(inputFile), qPrintable(input.errorString()));
            exit(1);
        }
    }

    QByteArray data = input.readAll();
    auto interfaces = QDBusIntrospection::parseInterfaces(QString::fromUtf8(data), &reporter);
    if (reporter.hadErrors())
        exit(1);

    return interfaces;
}